

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O2

void shim_vkDestroyDevice(VkDevice device,VkAllocationCallbacks *pAllocator)

{
  long lVar1;
  pointer pPVar2;
  __normal_iterator<VkDevice_T_**,_std::vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>_>
  __position;
  vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_> *this;
  VkDevice local_28;
  
  pPVar2 = mock.physical_devices_details.
           super__Vector_base<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_28 = device;
  for (this = &(mock.physical_devices_details.
                super__Vector_base<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>
                ._M_impl.super__Vector_impl_data._M_start)->created_device_handles;
      (pointer)(this + -0x668) != pPVar2; this = this + 0x698) {
    __position = std::
                 __find_if<__gnu_cxx::__normal_iterator<VkDevice_T**,std::vector<VkDevice_T*,std::allocator<VkDevice_T*>>>,__gnu_cxx::__ops::_Iter_equals_val<VkDevice_T*const>>
                           (*(undefined8 *)this,*(undefined8 *)(this + 8),&local_28);
    if (__position._M_current != *(VkDevice_T ***)(this + 8)) {
      lVar1 = *(long *)this;
      std::vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>::erase
                (this,(const_iterator)__position._M_current);
      std::
      vector<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>::
      erase((vector<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
             *)(this + 0x18),
            (CreatedDeviceDetails *)
            (((ulong)((long)__position._M_current - lVar1) >> 3) * 0x110 + *(long *)(this + 0x18)));
    }
  }
  return;
}

Assistant:

VKAPI_ATTR void VKAPI_CALL shim_vkDestroyDevice(
    [[maybe_unused]] VkDevice device, [[maybe_unused]] const VkAllocationCallbacks* pAllocator) {
    for (auto& physical_devices : mock.physical_devices_details) {
        auto it = std::find(
            std::begin(physical_devices.created_device_handles), std::end(physical_devices.created_device_handles), device);
        if (it != std::end(physical_devices.created_device_handles)) {
            auto index = it - physical_devices.created_device_handles.begin();
            physical_devices.created_device_handles.erase(it);
            physical_devices.created_device_details.erase(physical_devices.created_device_details.begin() + index);
        }
    }
}